

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

rf_model *
rf_load_model_from_obj
          (rf_model *__return_storage_ptr__,char *filename,rf_allocator allocator,
          rf_allocator temp_allocator,rf_io_callbacks io)

{
  size_t sVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined8 uVar8;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  byte bVar15;
  int iVar16;
  uint uVar17;
  undefined4 uVar18;
  float *pfVar19;
  long lVar20;
  short sVar21;
  undefined8 uVar22;
  rf_source_location rVar23;
  rf_source_location rVar24;
  rf_source_location rVar25;
  rf_source_location rVar26;
  rf_source_location rVar27;
  rf_source_location rVar28;
  rf_source_location rVar29;
  rf_source_location rVar30;
  rf_source_location rVar31;
  rf_source_location rVar32;
  rf_source_location rVar33;
  rf_source_location rVar34;
  rf_source_location rVar35;
  rf_source_location rVar36;
  rf_source_location rVar37;
  rf_source_location rVar38;
  rf_source_location rVar39;
  rf_source_location rVar40;
  rf_source_location rVar41;
  rf_source_location rVar42;
  rf_source_location rVar43;
  rf_source_location rVar44;
  rf_source_location rVar45;
  rf_source_location rVar46;
  rf_source_location rVar47;
  rf_source_location rVar48;
  rf_source_location rVar49;
  rf_source_location rVar50;
  rf_source_location rVar51;
  rf_source_location rVar52;
  rf_source_location rVar53;
  rf_source_location rVar54;
  rf_source_location rVar55;
  rf_source_location rVar56;
  rf_source_location rVar57;
  rf_allocator_args rVar58;
  rf_allocator_args rVar59;
  rf_allocator_args rVar60;
  rf_allocator_args rVar61;
  rf_allocator_args rVar62;
  rf_allocator_args rVar63;
  rf_allocator_args rVar64;
  rf_allocator_args rVar65;
  rf_allocator_args rVar66;
  rf_allocator_args rVar67;
  rf_allocator_args rVar68;
  rf_allocator_args rVar69;
  rf_allocator_args rVar70;
  rf_allocator allocator_00;
  rf_allocator allocator_01;
  rf_source_location rVar71;
  rf_source_location rVar72;
  rf_source_location rVar73;
  rf_source_location rVar74;
  rf_source_location rVar75;
  rf_source_location rVar76;
  rf_allocator_args rVar77;
  rf_allocator_args rVar78;
  rf_allocator_args rVar79;
  rf_allocator_args rVar80;
  rf_allocator_args rVar81;
  rf_allocator_args rVar82;
  undefined1 auVar83 [24];
  undefined1 auVar84 [24];
  undefined1 auVar85 [24];
  undefined1 auVar86 [24];
  undefined1 auVar87 [24];
  undefined1 auVar88 [24];
  undefined1 auVar89 [24];
  undefined1 auVar90 [24];
  undefined1 auVar91 [24];
  undefined1 auVar92 [24];
  undefined1 auVar93 [24];
  undefined1 auVar94 [24];
  undefined1 auVar95 [24];
  undefined1 auVar96 [24];
  undefined1 auVar97 [24];
  undefined1 auVar98 [24];
  undefined1 auVar99 [24];
  undefined1 auVar100 [24];
  undefined1 auVar101 [24];
  undefined1 auVar102 [24];
  undefined1 auVar103 [24];
  undefined1 auVar104 [24];
  void *__n;
  char cVar105;
  rf_allocator_proc *prVar106;
  undefined8 *puVar107;
  undefined4 *puVar108;
  undefined8 uVar109;
  void *__dest;
  rf_mesh *prVar110;
  float *pfVar111;
  int *piVar112;
  unsigned_short *puVar113;
  uint *puVar114;
  size_t sVar115;
  void *pvVar116;
  ulong uVar117;
  void *__dest_00;
  void *__dest_01;
  void *__dest_02;
  void *__dest_03;
  void *__dest_04;
  rf_bone_info *prVar118;
  rf_transform *prVar119;
  rf_material *__s;
  uint uVar120;
  rf_allocator_proc *prVar121;
  rf_allocator_proc *prVar122;
  long lVar123;
  undefined4 *puVar124;
  void *extraout_RDX;
  ulong uVar125;
  long lVar126;
  ulong uVar127;
  ulong uVar128;
  char *msg;
  rf_model *prVar129;
  char *pcVar130;
  rf_mesh *prVar131;
  rf_mesh *prVar132;
  rf_allocator_proc *prVar133;
  long in_FS_OFFSET;
  byte bVar134;
  float fVar135;
  float fVar137;
  undefined1 auVar136 [16];
  float fVar138;
  float fVar139;
  rf_vec3 rVar140;
  rf_quaternion q;
  rf_allocator temp_allocator_00;
  void *pvVar141;
  rf_allocator rStack_a50;
  rf_allocator rStack_a40;
  void *pvStack_a28;
  rf_bone_info *prStack_a20;
  ulong uStack_a18;
  ulong uStack_a10;
  long lStack_a08;
  void *pvStack_a00;
  rf_model *prStack_9f8;
  size_t sStack_9f0;
  void *pvStack_9e8;
  undefined8 uStack_9e0;
  undefined4 uStack_9d8;
  uint uStack_9d4;
  char *pcStack_9d0;
  char *pcStack_9c8;
  undefined8 uStack_9c0;
  void *pvStack_9b8;
  undefined8 uStack_9b0;
  undefined4 uStack_9a8;
  uint uStack_9a4;
  char *pcStack_9a0;
  char *pcStack_998;
  undefined8 uStack_990;
  void *pvStack_988;
  undefined8 uStack_980;
  undefined4 uStack_978;
  uint uStack_974;
  char *pcStack_970;
  char *pcStack_968;
  undefined8 uStack_960;
  void *pvStack_958;
  undefined8 uStack_950;
  undefined4 uStack_948;
  uint uStack_944;
  char *pcStack_940;
  char *pcStack_938;
  undefined8 uStack_930;
  void *pvStack_928;
  undefined8 uStack_920;
  undefined4 uStack_918;
  uint uStack_914;
  char *pcStack_910;
  char *pcStack_908;
  undefined8 uStack_900;
  void *pvStack_8f8;
  undefined8 uStack_8f0;
  undefined4 uStack_8e8;
  uint uStack_8e4;
  char *pcStack_8e0;
  char *pcStack_8d8;
  undefined8 uStack_8d0;
  void *pvStack_8c8;
  undefined8 uStack_8c0;
  undefined4 uStack_8b8;
  uint uStack_8b4;
  char *pcStack_8b0;
  char *pcStack_8a8;
  undefined8 uStack_8a0;
  void *pvStack_898;
  undefined8 uStack_890;
  undefined4 uStack_888;
  uint uStack_884;
  char *pcStack_880;
  char *pcStack_878;
  undefined8 uStack_870;
  void *pvStack_868;
  undefined8 uStack_860;
  undefined4 uStack_858;
  uint uStack_854;
  char *pcStack_850;
  char *pcStack_848;
  undefined8 uStack_840;
  undefined8 uStack_838;
  long lStack_830;
  undefined4 uStack_828;
  uint uStack_824;
  char *pcStack_820;
  char *pcStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  long lStack_800;
  undefined4 uStack_7f8;
  uint uStack_7f4;
  char *pcStack_7f0;
  char *pcStack_7e8;
  undefined8 uStack_7e0;
  undefined8 uStack_7d8;
  size_t sStack_7d0;
  undefined4 uStack_7c8;
  uint uStack_7c4;
  char *pcStack_7c0;
  char *pcStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  size_t sStack_7a0;
  undefined4 uStack_798;
  uint uStack_794;
  char *pcStack_790;
  char *pcStack_788;
  undefined8 uStack_780;
  undefined8 uStack_778;
  size_t sStack_770;
  undefined4 uStack_768;
  uint uStack_764;
  char *pcStack_760;
  char *pcStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  size_t sStack_740;
  undefined4 uStack_738;
  uint uStack_734;
  char *pcStack_730;
  char *pcStack_728;
  undefined8 uStack_720;
  undefined8 uStack_718;
  size_t sStack_710;
  undefined4 uStack_708;
  uint uStack_704;
  char *pcStack_700;
  char *pcStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  size_t sStack_6e0;
  undefined4 uStack_6d8;
  uint uStack_6d4;
  char *pcStack_6d0;
  char *pcStack_6c8;
  undefined8 uStack_6c0;
  undefined8 uStack_6b8;
  size_t sStack_6b0;
  undefined4 uStack_6a8;
  uint uStack_6a4;
  char *pcStack_6a0;
  char *pcStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  size_t sStack_680;
  undefined4 uStack_678;
  uint uStack_674;
  char *pcStack_670;
  char *pcStack_668;
  undefined8 uStack_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined4 uStack_648;
  uint uStack_644;
  char *pcStack_640;
  char *pcStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  long lStack_620;
  undefined4 uStack_618;
  uint uStack_614;
  char *pcStack_610;
  char *pcStack_608;
  undefined8 uStack_600;
  undefined8 uStack_5f8;
  long lStack_5f0;
  undefined4 uStack_5e8;
  uint uStack_5e4;
  char *pcStack_5e0;
  char *pcStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  long lStack_5c0;
  undefined4 uStack_5b8;
  uint uStack_5b4;
  char *pcStack_5b0;
  char *pcStack_5a8;
  undefined8 uStack_5a0;
  undefined8 uStack_598;
  long lStack_590;
  undefined4 uStack_588;
  uint uStack_584;
  char *pcStack_580;
  char *pcStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  long lStack_560;
  undefined4 uStack_558;
  uint uStack_554;
  char *pcStack_550;
  char *pcStack_548;
  undefined8 uStack_540;
  undefined8 uStack_538;
  long lStack_530;
  undefined4 uStack_528;
  uint uStack_524;
  char *pcStack_520;
  char *pcStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  long lStack_500;
  undefined4 uStack_4f8;
  uint uStack_4f4;
  char *pcStack_4f0;
  char *pcStack_4e8;
  undefined8 uStack_4e0;
  undefined8 uStack_4d8;
  long lStack_4d0;
  undefined4 uStack_4c8;
  uint uStack_4c4;
  char *pcStack_4c0;
  char *pcStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  long lStack_4a0;
  undefined4 uStack_498;
  uint uStack_494;
  char *pcStack_490;
  char *pcStack_488;
  undefined8 uStack_480;
  undefined8 uStack_478;
  size_t sStack_470;
  undefined4 uStack_468;
  uint uStack_464;
  char *pcStack_460;
  char *pcStack_458;
  undefined8 uStack_450;
  undefined4 *puStack_448;
  undefined8 uStack_440;
  undefined4 uStack_438;
  uint uStack_434;
  char *pcStack_430;
  char *pcStack_428;
  undefined8 uStack_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined4 uStack_408;
  uint uStack_404;
  char *pcStack_400;
  char *pcStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  size_t sStack_3e0;
  undefined4 uStack_3d8;
  uint uStack_3d4;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined4 uStack_3c0;
  uint uStack_3bc;
  char *pcStack_3b8;
  char *pcStack_3b0;
  undefined8 uStack_3a8;
  undefined8 uStack_3a0;
  undefined8 uStack_398;
  undefined4 uStack_390;
  uint uStack_38c;
  char *pcStack_388;
  char *pcStack_380;
  undefined8 uStack_378;
  rf_allocator rStack_370;
  char *pcStack_360;
  char *pcStack_358;
  undefined8 uStack_350;
  char *pcStack_348;
  char *pcStack_340;
  undefined8 uStack_338;
  char *pcStack_330;
  char *pcStack_328;
  undefined8 uStack_320;
  char *pcStack_318;
  char *pcStack_310;
  undefined8 uStack_308;
  char cStack_2fc;
  char cStack_2fb;
  char cStack_2fa;
  char cStack_2f9;
  char cStack_2f8;
  char cStack_2f7;
  char cStack_2f6;
  char cStack_2f5;
  char cStack_2f4;
  char cStack_2f3;
  char cStack_2f2;
  char cStack_2f1;
  char cStack_2f0;
  char cStack_2ef;
  char cStack_2ee;
  char cStack_2ed;
  int iStack_2ec;
  uint uStack_2dc;
  uint uStack_2d8;
  uint uStack_2d4;
  uint uStack_2d0;
  int iStack_2cc;
  uint uStack_2c8;
  uint uStack_2c4;
  uint uStack_2c0;
  uint uStack_2b8;
  uint uStack_2b4;
  rf_mesh rStack_280;
  rf_model *prStack_1e8;
  char *pcStack_1e0;
  undefined8 uStack_1d8;
  rf_allocator_proc *prStack_1d0;
  char *pcStack_1c8;
  code *pcVar142;
  code *pcVar143;
  uint uStack_16c;
  uint uStack_f4;
  uint uStack_c4;
  void *local_a8;
  rf_allocator_proc *local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  float local_88;
  float fStack_84;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined4 local_68;
  uint uStack_64;
  rf_int local_58;
  rf_material *prStack_50;
  undefined4 local_48;
  uint uStack_44;
  char *local_40;
  char *pcStack_38;
  rf_transform *local_30;
  
  prVar133 = temp_allocator.allocator_proc;
  prVar132 = (rf_mesh *)temp_allocator.user_data;
  prVar121 = allocator.allocator_proc;
  local_a8 = allocator.user_data;
  bVar134 = 0;
  *(rf_mesh **)(in_FS_OFFSET + -0x430) = prVar132;
  *(rf_allocator_proc **)(in_FS_OFFSET + -0x428) = prVar133;
  *(void **)(in_FS_OFFSET + -0x420) = io.user_data;
  *(_func_rf_int_void_ptr_char_ptr **)(in_FS_OFFSET + -0x418) = io.file_size_proc;
  *(_func__Bool_void_ptr_char_ptr_void_ptr_rf_int **)(in_FS_OFFSET + -0x410) = io.read_file_proc;
  prVar122 = prVar121;
  local_a0 = prVar121;
  if ((filename != (char *)0x0) &&
     (prVar106 = (rf_allocator_proc *)
                 (**(code **)(in_FS_OFFSET + -0x418))
                           (*(undefined8 *)(in_FS_OFFSET + -0x420),filename),
     prVar106 != (rf_allocator_proc *)0x0)) {
    (**(code **)(in_FS_OFFSET + -0x410))(*(undefined8 *)(in_FS_OFFSET + -0x420),filename,0);
    prVar122 = prVar106;
  }
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  pcStack_38 = "rf_load_model_from_obj";
  local_30 = (rf_transform *)0x8259;
  rf_log_impl(4,0x17bb1c,filename);
  rVar71.proc_name = "rf_load_model_from_obj";
  rVar71.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar71.line_in_file = 0x8265;
  rVar77._16_8_ = (ulong)uStack_c4 << 0x20;
  rVar77.pointer_to_free_or_realloc = (void *)SUB168(ZEXT816(0x70) << 0x40,0);
  rVar77.size_to_allocate_or_reallocate = SUB168(ZEXT816(0x70) << 0x40,8);
  puVar107 = (undefined8 *)(*prVar121)((rf_allocator *)&local_a8,rVar71,RF_AM_ALLOC,rVar77);
  *puVar107 = 0;
  puVar107[1] = 0;
  puVar107[2] = 0;
  puVar107[3] = 0;
  puVar107[4] = 0;
  puVar107[5] = 0;
  puVar107[6] = 0;
  puVar107[7] = 0;
  puVar107[8] = 0;
  puVar107[9] = 0;
  puVar107[10] = 0;
  puVar107[0xb] = 0;
  puVar107[0xc] = 0;
  puVar107[0xd] = 0;
  rVar72.proc_name = "rf_load_model_from_obj";
  rVar72.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar72.line_in_file = 0x8271;
  rVar78._16_8_ = (ulong)uStack_f4 << 0x20;
  rVar78.pointer_to_free_or_realloc = (void *)SUB168(ZEXT816(4) << 0x40,0);
  rVar78.size_to_allocate_or_reallocate = SUB168(ZEXT816(4) << 0x40,8);
  puVar108 = (undefined4 *)(*local_a0)((rf_allocator *)&local_a8,rVar72,RF_AM_ALLOC,rVar78);
  *puVar108 = 0;
  local_48 = 0;
  local_58 = 0;
  prStack_50 = (rf_material *)0x0;
  rVar73.proc_name = "rf_load_model_from_obj";
  rVar73.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar73.line_in_file = 0x827c;
  rVar79._16_8_ = (ulong)uStack_44 << 0x20;
  rVar79.pointer_to_free_or_realloc = (void *)0x0;
  rVar79.size_to_allocate_or_reallocate = 0;
  (*local_a0)((rf_allocator *)&local_a8,rVar73,RF_AM_ALLOC,rVar79);
  local_78._0_4_ = 0.0;
  local_78._4_4_ = 0.0;
  uStack_70._0_4_ = 0.0;
  uStack_70._4_4_ = 0.0;
  local_68 = 0;
  rVar74.proc_name = "rf_load_model_from_obj";
  rVar74.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar74.line_in_file = 0x827d;
  rVar80._16_8_ = (ulong)uStack_64 << 0x20;
  rVar80.pointer_to_free_or_realloc = (void *)0x0;
  rVar80.size_to_allocate_or_reallocate = 0;
  (*local_a0)((rf_allocator *)&local_a8,rVar74,RF_AM_ALLOC,rVar80);
  local_98._0_4_ = 0.0;
  local_98._4_4_ = 0.0;
  uStack_90._0_4_ = 0.0;
  uStack_90._4_4_ = 0.0;
  local_88 = 0.0;
  rVar75.proc_name = "rf_load_model_from_obj";
  rVar75.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar75.line_in_file = 0x827e;
  rVar81._16_8_ = (ulong)(uint)fStack_84 << 0x20;
  rVar81.pointer_to_free_or_realloc = (void *)0x0;
  rVar81.size_to_allocate_or_reallocate = 0;
  (*local_a0)((rf_allocator *)&local_a8,rVar75,RF_AM_ALLOC,rVar81);
  pcVar143 = (code *)0x0;
  pcVar142 = (code *)0x827f;
  pcVar130 = "rf_load_model_from_obj";
  msg = (char *)0x1;
  rVar76.proc_name = "rf_load_model_from_obj";
  rVar76.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar76.line_in_file = 0x827f;
  rVar82._16_8_ = (ulong)uStack_16c << 0x20;
  rVar82.pointer_to_free_or_realloc = (void *)SUB168(ZEXT816(0x1c) << 0x40,0);
  rVar82.size_to_allocate_or_reallocate = SUB168(ZEXT816(0x1c) << 0x40,8);
  prVar129 = (rf_model *)&local_a8;
  (*local_a0)((rf_allocator *)&local_a8,rVar76,RF_AM_ALLOC,rVar82);
  pcStack_1c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  uStack_1d8 = 0;
  pcStack_1e0 = "rf_load_model_from_obj";
  rStack_a50.user_data = prVar132;
  rStack_a50.allocator_proc = prVar133;
  rStack_a40.user_data = extraout_RDX;
  rStack_a40.allocator_proc = prVar122;
  prStack_1e8 = (rf_model *)&local_a8;
  prStack_1d0 = prVar121;
  uVar109 = (*pcVar142)(pcVar130);
  pcStack_400 = 
  "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  pcStack_3f8 = "rf_load_model_from_iqm";
  uStack_3f0 = 0x8355;
  uStack_418 = 0;
  uStack_408 = 0;
  rVar23.proc_name = "rf_load_model_from_iqm";
  rVar23.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar23.line_in_file = 0x8355;
  auVar83._8_8_ = (ulong)uStack_404 << 0x20;
  auVar83._0_8_ = uVar109;
  auVar83._16_8_ = 0;
  uStack_410 = uVar109;
  puVar108 = (undefined4 *)
             (*prVar133)(&rStack_a50,rVar23,RF_AM_ALLOC,(rf_allocator_args)(auVar83 << 0x40));
  cVar105 = (*pcVar143)(pcVar130,msg,puVar108,uVar109);
  if (cVar105 != '\0') {
    pcStack_430 = 
    "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    pcStack_428 = "rf_load_model_from_iqm";
    uStack_420 = 0x8359;
    uStack_440 = 0;
    uStack_438 = 0;
    rVar24.proc_name = "rf_load_model_from_iqm";
    rVar24.file_name =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    rVar24.line_in_file = 0x8359;
    rVar58.size_to_allocate_or_reallocate = 0;
    rVar58.pointer_to_free_or_realloc = puVar108;
    rVar58._16_8_ = (ulong)uStack_434 << 0x20;
    puStack_448 = puVar108;
    (*rStack_a50.allocator_proc)(&rStack_a50,rVar24,RF_AM_FREE,rVar58);
  }
  puVar124 = puVar108;
  pcVar130 = &cStack_2fc;
  for (lVar123 = 0x1f; lVar123 != 0; lVar123 = lVar123 + -1) {
    *(undefined4 *)pcVar130 = *puVar124;
    puVar124 = puVar124 + (ulong)bVar134 * -2 + 1;
    pcVar130 = pcVar130 + ((ulong)bVar134 * -2 + 1) * 4;
  }
  auVar136[0] = -(cStack_2fc == 'I');
  auVar136[1] = -(cStack_2fb == 'N');
  auVar136[2] = -(cStack_2fa == 'T');
  auVar136[3] = -(cStack_2f9 == 'E');
  auVar136[4] = -(cStack_2f8 == 'R');
  auVar136[5] = -(cStack_2f7 == 'Q');
  auVar136[6] = -(cStack_2f6 == 'U');
  auVar136[7] = -(cStack_2f5 == 'A');
  auVar136[8] = -(cStack_2f4 == 'K');
  auVar136[9] = -(cStack_2f3 == 'E');
  auVar136[10] = -(cStack_2f2 == 'M');
  auVar136[0xb] = -(cStack_2f1 == 'O');
  auVar136[0xc] = -(cStack_2f0 == 'D');
  auVar136[0xd] = -(cStack_2ef == 'E');
  auVar136[0xe] = -(cStack_2ee == 'L');
  auVar136[0xf] = -(cStack_2ed == '\0');
  if ((ushort)((ushort)(SUB161(auVar136 >> 7,0) & 1) | (ushort)(SUB161(auVar136 >> 0xf,0) & 1) << 1
               | (ushort)(SUB161(auVar136 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar136 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar136 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar136 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar136 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar136 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar136 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar136 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar136 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar136 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar136 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar136 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar136 >> 0x77,0) & 1) << 0xe | (ushort)(auVar136[0xf] >> 7) << 0xf
              ) == 0xffff) {
    if (iStack_2ec == 2) {
      pcStack_460 = 
      "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      pcStack_458 = "rf_load_model_from_iqm";
      uStack_450 = 0x8376;
      uStack_478 = 0;
      uVar117 = (ulong)uStack_2d8;
      sVar1 = uVar117 * 0x18;
      uStack_468 = 0;
      rVar25.proc_name = "rf_load_model_from_iqm";
      rVar25.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      rVar25.line_in_file = 0x8376;
      auVar84._8_8_ = (ulong)uStack_464 << 0x20;
      auVar84._0_8_ = sVar1;
      auVar84._16_8_ = 0;
      prStack_9f8 = prVar129;
      sStack_470 = sVar1;
      __dest = (*rStack_a50.allocator_proc)
                         (&rStack_a50,rVar25,RF_AM_ALLOC,(rf_allocator_args)(auVar84 << 0x40));
      memcpy(__dest,(void *)((ulong)uStack_2d4 + (long)puVar108),sVar1);
      pcStack_490 = 
      "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      pcStack_488 = "rf_load_model_from_iqm";
      uStack_480 = 0x837a;
      uStack_4a8 = 0;
      lStack_a08 = uVar117 * 0x70;
      uStack_498 = 0;
      rVar26.proc_name = "rf_load_model_from_iqm";
      rVar26.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      rVar26.line_in_file = 0x837a;
      auVar85._8_8_ = (ulong)uStack_494 << 0x20;
      auVar85._0_8_ = lStack_a08;
      auVar85._16_8_ = 0;
      lStack_4a0 = lStack_a08;
      prVar110 = (rf_mesh *)
                 (*rStack_a40.allocator_proc)
                           (&rStack_a40,rVar26,RF_AM_ALLOC,(rf_allocator_args)(auVar85 << 0x40));
      prVar131 = prVar110;
      uStack_a18 = uVar117;
      if (uVar117 != 0) {
        sVar115 = 0;
        do {
          iVar16 = *(int *)((long)__dest + sVar115 + 0xc);
          prVar110->vertex_count = iVar16;
          *(undefined8 *)&prVar110->triangle_count = 0;
          *(undefined8 *)((long)&prVar110->vertices + 4) = 0;
          *(undefined8 *)((long)&prVar110->texcoords + 4) = 0;
          *(undefined8 *)((long)&prVar110->texcoords2 + 4) = 0;
          *(undefined8 *)((long)&prVar110->normals + 4) = 0;
          *(undefined8 *)((long)&prVar110->tangents + 4) = 0;
          *(undefined8 *)((long)&prVar110->colors + 4) = 0;
          *(undefined8 *)((long)&prVar110->indices + 4) = 0;
          *(undefined8 *)((long)&prVar110->anim_vertices + 4) = 0;
          *(undefined8 *)((long)&prVar110->anim_normals + 4) = 0;
          *(undefined8 *)((long)&prVar110->bone_ids + 4) = 0;
          *(undefined8 *)((long)&prVar110->bone_weights + 4) = 0;
          *(undefined8 *)&prVar110->vao_id = 0;
          prVar110->vbo_id = (uint *)0x0;
          pcStack_4c0 = 
          "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
          ;
          pcStack_4b8 = "rf_load_model_from_iqm";
          uStack_4b0 = 0x8385;
          uStack_4d8 = 0;
          lStack_4d0 = (long)iVar16 * 0xc;
          uStack_4c8 = 0;
          rVar27.proc_name = "rf_load_model_from_iqm";
          rVar27.file_name =
               "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
          ;
          rVar27.line_in_file = 0x8385;
          auVar86._8_8_ = (ulong)uStack_4c4 << 0x20;
          auVar86._0_8_ = lStack_4d0;
          auVar86._16_8_ = 0;
          pfVar111 = (float *)(*rStack_a40.allocator_proc)
                                        (&rStack_a40,rVar27,RF_AM_ALLOC,
                                         (rf_allocator_args)(auVar86 << 0x40));
          prVar110->vertices = pfVar111;
          memset(pfVar111,0,(long)prVar110->vertex_count * 0xc);
          pcStack_4f0 = 
          "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
          ;
          pcStack_4e8 = "rf_load_model_from_iqm";
          uStack_4e0 = 0x8388;
          uStack_508 = 0;
          lStack_500 = (long)prVar110->vertex_count * 0xc;
          uStack_4f8 = 0;
          rVar28.proc_name = "rf_load_model_from_iqm";
          rVar28.file_name =
               "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
          ;
          rVar28.line_in_file = 0x8388;
          auVar87._8_8_ = (ulong)uStack_4f4 << 0x20;
          auVar87._0_8_ = lStack_500;
          auVar87._16_8_ = 0;
          pfVar111 = (float *)(*rStack_a40.allocator_proc)
                                        (&rStack_a40,rVar28,RF_AM_ALLOC,
                                         (rf_allocator_args)(auVar87 << 0x40));
          prVar110->normals = pfVar111;
          memset(pfVar111,0,(long)prVar110->vertex_count * 0xc);
          pcStack_520 = 
          "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
          ;
          pcStack_518 = "rf_load_model_from_iqm";
          uStack_510 = 0x838b;
          uStack_538 = 0;
          lStack_530 = (long)prVar110->vertex_count << 3;
          uStack_528 = 0;
          rVar29.proc_name = "rf_load_model_from_iqm";
          rVar29.file_name =
               "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
          ;
          rVar29.line_in_file = 0x838b;
          auVar88._8_8_ = (ulong)uStack_524 << 0x20;
          auVar88._0_8_ = lStack_530;
          auVar88._16_8_ = 0;
          pfVar111 = (float *)(*rStack_a40.allocator_proc)
                                        (&rStack_a40,rVar29,RF_AM_ALLOC,
                                         (rf_allocator_args)(auVar88 << 0x40));
          prVar110->texcoords = pfVar111;
          memset(pfVar111,0,(long)prVar110->vertex_count << 3);
          pcStack_550 = 
          "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
          ;
          pcStack_548 = "rf_load_model_from_iqm";
          uStack_540 = 0x838e;
          uStack_568 = 0;
          lStack_560 = (long)prVar110->vertex_count << 4;
          uStack_558 = 0;
          rVar30.proc_name = "rf_load_model_from_iqm";
          rVar30.file_name =
               "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
          ;
          rVar30.line_in_file = 0x838e;
          auVar89._8_8_ = (ulong)uStack_554 << 0x20;
          auVar89._0_8_ = lStack_560;
          auVar89._16_8_ = 0;
          piVar112 = (int *)(*rStack_a40.allocator_proc)
                                      (&rStack_a40,rVar30,RF_AM_ALLOC,
                                       (rf_allocator_args)(auVar89 << 0x40));
          prVar110->bone_ids = piVar112;
          memset(piVar112,0,(long)prVar110->vertex_count << 4);
          pcStack_580 = 
          "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
          ;
          pcStack_578 = "rf_load_model_from_iqm";
          uStack_570 = 0x8391;
          uStack_598 = 0;
          lStack_590 = (long)prVar110->vertex_count << 4;
          uStack_588 = 0;
          rVar31.proc_name = "rf_load_model_from_iqm";
          rVar31.file_name =
               "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
          ;
          rVar31.line_in_file = 0x8391;
          auVar90._8_8_ = (ulong)uStack_584 << 0x20;
          auVar90._0_8_ = lStack_590;
          auVar90._16_8_ = 0;
          pfVar111 = (float *)(*rStack_a40.allocator_proc)
                                        (&rStack_a40,rVar31,RF_AM_ALLOC,
                                         (rf_allocator_args)(auVar90 << 0x40));
          prVar110->bone_weights = pfVar111;
          memset(pfVar111,0,(long)prVar110->vertex_count << 4);
          iVar16 = *(int *)((long)__dest + sVar115 + 0x14);
          prVar110->triangle_count = iVar16;
          pcStack_5b0 = 
          "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
          ;
          pcStack_5a8 = "rf_load_model_from_iqm";
          uStack_5a0 = 0x8396;
          uStack_5c8 = 0;
          lStack_5c0 = (long)iVar16 * 6;
          uStack_5b8 = 0;
          rVar32.proc_name = "rf_load_model_from_iqm";
          rVar32.file_name =
               "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
          ;
          rVar32.line_in_file = 0x8396;
          auVar91._8_8_ = (ulong)uStack_5b4 << 0x20;
          auVar91._0_8_ = lStack_5c0;
          auVar91._16_8_ = 0;
          puVar113 = (unsigned_short *)
                     (*rStack_a40.allocator_proc)
                               (&rStack_a40,rVar32,RF_AM_ALLOC,(rf_allocator_args)(auVar91 << 0x40))
          ;
          prVar110->indices = puVar113;
          memset(puVar113,0,(long)prVar110->triangle_count * 6);
          pcStack_5e0 = 
          "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
          ;
          pcStack_5d8 = "rf_load_model_from_iqm";
          uStack_5d0 = 0x839b;
          uStack_5f8 = 0;
          lStack_5f0 = (long)prVar110->vertex_count * 0xc;
          uStack_5e8 = 0;
          rVar33.proc_name = "rf_load_model_from_iqm";
          rVar33.file_name =
               "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
          ;
          rVar33.line_in_file = 0x839b;
          auVar92._8_8_ = (ulong)uStack_5e4 << 0x20;
          auVar92._0_8_ = lStack_5f0;
          auVar92._16_8_ = 0;
          pfVar111 = (float *)(*rStack_a40.allocator_proc)
                                        (&rStack_a40,rVar33,RF_AM_ALLOC,
                                         (rf_allocator_args)(auVar92 << 0x40));
          prVar110->anim_vertices = pfVar111;
          memset(pfVar111,0,(long)prVar110->vertex_count * 0xc);
          pcStack_610 = 
          "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
          ;
          pcStack_608 = "rf_load_model_from_iqm";
          uStack_600 = 0x839e;
          uStack_628 = 0;
          lStack_620 = (long)prVar110->vertex_count * 0xc;
          uStack_618 = 0;
          rVar34.proc_name = "rf_load_model_from_iqm";
          rVar34.file_name =
               "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
          ;
          rVar34.line_in_file = 0x839e;
          auVar93._8_8_ = (ulong)uStack_614 << 0x20;
          auVar93._0_8_ = lStack_620;
          auVar93._16_8_ = 0;
          pfVar111 = (float *)(*rStack_a40.allocator_proc)
                                        (&rStack_a40,rVar34,RF_AM_ALLOC,
                                         (rf_allocator_args)(auVar93 << 0x40));
          prVar110->anim_normals = pfVar111;
          memset(pfVar111,0,(long)prVar110->vertex_count * 0xc);
          pcStack_640 = 
          "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
          ;
          pcStack_638 = "rf_load_model_from_iqm";
          uStack_630 = 0x83a1;
          uStack_658 = 0;
          uStack_650 = 0x1c;
          uStack_648 = 0;
          rVar35.proc_name = "rf_load_model_from_iqm";
          rVar35.file_name =
               "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
          ;
          rVar35.line_in_file = 0x83a1;
          rVar59._16_8_ = (ulong)uStack_644 << 0x20;
          rVar59.pointer_to_free_or_realloc = (void *)SUB168(ZEXT816(0x1c) << 0x40,0);
          rVar59.size_to_allocate_or_reallocate = SUB168(ZEXT816(0x1c) << 0x40,8);
          puVar114 = (uint *)(*rStack_a40.allocator_proc)(&rStack_a40,rVar35,RF_AM_ALLOC,rVar59);
          prVar110->vbo_id = puVar114;
          puVar114[0] = 0;
          puVar114[1] = 0;
          puVar114[2] = 0;
          puVar114[3] = 0;
          puVar114[3] = 0;
          puVar114[4] = 0;
          puVar114[5] = 0;
          puVar114[6] = 0;
          sVar115 = sVar115 + 0x18;
          prVar110 = prVar110 + 1;
        } while (sVar1 != sVar115);
      }
      pcStack_670 = 
      "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      pcStack_668 = "rf_load_model_from_iqm";
      uStack_660 = 0x83a6;
      uStack_688 = 0;
      sVar1 = (ulong)uStack_2c4 * 0xc;
      uStack_678 = 0;
      rVar36.proc_name = "rf_load_model_from_iqm";
      rVar36.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      rVar36.line_in_file = 0x83a6;
      auVar94._8_8_ = (ulong)uStack_674 << 0x20;
      auVar94._0_8_ = sVar1;
      auVar94._16_8_ = 0;
      sStack_680 = sVar1;
      pvVar116 = (*rStack_a50.allocator_proc)
                           (&rStack_a50,rVar36,RF_AM_ALLOC,(rf_allocator_args)(auVar94 << 0x40));
      memcpy(pvVar116,(void *)((ulong)uStack_2c0 + (long)puVar108),sVar1);
      if (uStack_a18 != 0) {
        uVar117 = 0;
        do {
          uVar17 = *(uint *)((long)__dest + uVar117 * 0x18 + 0x10);
          uVar127 = (ulong)uVar17;
          uVar120 = *(int *)((long)__dest + uVar117 * 0x18 + 0x14) + uVar17;
          if (uVar17 < uVar120) {
            uVar18 = *(undefined4 *)((long)__dest + uVar117 * 0x18 + 8);
            puVar113 = prVar131[uVar117].indices;
            lVar123 = uVar120 - uVar127;
            prVar132 = (rf_mesh *)0x4;
            do {
              sVar21 = (short)uVar18;
              *(short *)((long)puVar113 + (long)prVar132) =
                   (short)*(undefined4 *)((long)pvVar116 + (long)prVar132 * 2 + uVar127 * 0xc + -8)
                   - sVar21;
              *(short *)((long)(puVar113 + -1) + (long)prVar132) =
                   (short)*(undefined4 *)((long)pvVar116 + (long)prVar132 * 2 + uVar127 * 0xc + -4)
                   - sVar21;
              *(short *)((long)(puVar113 + -2) + (long)prVar132) =
                   (short)*(undefined4 *)((long)pvVar116 + (long)prVar132 * 2 + uVar127 * 0xc) -
                   sVar21;
              prVar132 = (rf_mesh *)((long)&prVar132->triangle_count + 2);
              lVar123 = lVar123 + -1;
            } while (lVar123 != 0);
          }
          uVar117 = uVar117 + 1;
        } while (uVar117 != uStack_a18);
      }
      pcStack_6a0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      pcStack_698 = "rf_load_model_from_iqm";
      uStack_690 = 0x83b8;
      uStack_6b8 = 0;
      uVar117 = (ulong)uStack_2d0;
      sVar1 = uVar117 * 0x14;
      uStack_6a8 = 0;
      rVar37.proc_name = "rf_load_model_from_iqm";
      rVar37.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      rVar37.line_in_file = 0x83b8;
      auVar95._8_8_ = (ulong)uStack_6a4 << 0x20;
      auVar95._0_8_ = sVar1;
      auVar95._16_8_ = 0;
      pvStack_a00 = pvVar116;
      sStack_6b0 = sVar1;
      pvVar116 = (*rStack_a50.allocator_proc)
                           (&rStack_a50,rVar37,RF_AM_ALLOC,(rf_allocator_args)(auVar95 << 0x40));
      memcpy(pvVar116,(void *)((ulong)uStack_2c8 + (long)puVar108),sVar1);
      pvVar141 = pvVar116;
      if (uVar117 == 0) {
        __dest_04 = (void *)0x0;
        __dest_03 = (void *)0x0;
        __dest_02 = (void *)0x0;
        __dest_01 = (void *)0x0;
        __dest_00 = (void *)0x0;
        uStack_a10 = uVar117;
      }
      else {
        uVar127 = (ulong)uStack_2d8;
        prStack_a20 = (rf_bone_info *)(ulong)(uint)(iStack_2cc * 4);
        sStack_9f0 = (ulong)(uint)(iStack_2cc * 2) << 2;
        pvStack_a28 = (void *)((ulong)(uint)(iStack_2cc * 3) << 2);
        __dest_00 = (void *)0x0;
        __dest_01 = (void *)0x0;
        __dest_02 = (void *)0x0;
        __dest_03 = (void *)0x0;
        __dest_04 = (void *)0x0;
        uVar128 = 0;
        uStack_a10 = uVar117;
        do {
          sVar1 = sStack_9f0;
          prVar118 = prStack_a20;
          __n = pvStack_a28;
          switch(*(undefined4 *)((long)pvVar116 + uVar128 * 0x14)) {
          case 0:
            pcStack_6d0 = 
            "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
            ;
            pcStack_6c8 = "rf_load_model_from_iqm";
            uStack_6c0 = 0x83c1;
            uStack_6e8 = 0;
            sStack_6e0 = (size_t)pvStack_a28;
            uStack_6d8 = 0;
            rVar38.proc_name = "rf_load_model_from_iqm";
            rVar38.file_name =
                 "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
            ;
            rVar38.line_in_file = 0x83c1;
            auVar96._8_8_ = (ulong)uStack_6d4 << 0x20;
            auVar96._0_8_ = pvStack_a28;
            auVar96._16_8_ = 0;
            __dest_00 = (*rStack_a50.allocator_proc)
                                  (&rStack_a50,rVar38,RF_AM_ALLOC,
                                   (rf_allocator_args)(auVar96 << 0x40));
            puVar114 = (uint *)((long)pvVar116 + uVar128 * 0x14 + 0x10);
            pvVar116 = pvVar141;
            memcpy(__dest_00,(void *)((ulong)*puVar114 + (long)puVar108),(size_t)__n);
            pvVar141 = pvVar116;
            if (uVar127 != 0) {
              uVar117 = 0;
              do {
                iVar16 = *(int *)((long)__dest + uVar117 * 0x18 + 8);
                uVar17 = iVar16 * 3;
                uVar120 = (iVar16 + *(int *)((long)__dest + uVar117 * 0x18 + 0xc)) * 3;
                if (uVar17 < uVar120) {
                  pfVar111 = prVar131[uVar117].vertices;
                  pfVar19 = prVar131[uVar117].anim_vertices;
                  prVar132 = (rf_mesh *)0x0;
                  do {
                    fVar135 = *(float *)((long)__dest_00 + (long)prVar132 * 4 + (ulong)uVar17 * 4);
                    pfVar111[(long)prVar132] = fVar135;
                    pfVar19[(long)prVar132] = fVar135;
                    prVar132 = (rf_mesh *)((long)&prVar132->vertex_count + 1);
                  } while ((rf_mesh *)((ulong)uVar120 - (ulong)uVar17) != prVar132);
                }
                uVar117 = uVar117 + 1;
              } while (uVar117 != uVar127);
            }
            break;
          case 1:
            pcStack_730 = 
            "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
            ;
            pcStack_728 = "rf_load_model_from_iqm";
            uStack_720 = 0x83e3;
            uStack_748 = 0;
            sStack_740 = sStack_9f0;
            uStack_738 = 0;
            rVar40.proc_name = "rf_load_model_from_iqm";
            rVar40.file_name =
                 "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
            ;
            rVar40.line_in_file = 0x83e3;
            auVar98._8_8_ = (ulong)uStack_734 << 0x20;
            auVar98._0_8_ = sStack_9f0;
            auVar98._16_8_ = 0;
            __dest_02 = (*rStack_a50.allocator_proc)
                                  (&rStack_a50,rVar40,RF_AM_ALLOC,
                                   (rf_allocator_args)(auVar98 << 0x40));
            puVar114 = (uint *)((long)pvVar116 + uVar128 * 0x14 + 0x10);
            pvVar116 = pvVar141;
            memcpy(__dest_02,(void *)((ulong)*puVar114 + (long)puVar108),sVar1);
            pvVar141 = pvVar116;
            if (uVar127 == 0) goto switchD_0013b4e9_caseD_3;
            uVar117 = 0;
            do {
              iVar16 = *(int *)((long)__dest + uVar117 * 0x18 + 8);
              uVar17 = iVar16 * 2;
              uVar120 = (iVar16 + *(int *)((long)__dest + uVar117 * 0x18 + 0xc)) * 2;
              if (uVar17 < uVar120) {
                pfVar111 = prVar131[uVar117].texcoords;
                lVar123 = 0;
                do {
                  pfVar111[lVar123] = *(float *)((long)__dest_02 + lVar123 * 4 + (ulong)uVar17 * 4);
                  lVar123 = lVar123 + 1;
                } while ((ulong)uVar120 - (ulong)uVar17 != lVar123);
              }
              uVar117 = uVar117 + 1;
              prVar132 = prVar131;
            } while (uVar117 != uVar127);
            break;
          case 2:
            pcStack_700 = 
            "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
            ;
            pcStack_6f8 = "rf_load_model_from_iqm";
            uStack_6f0 = 0x83d2;
            uStack_718 = 0;
            sStack_710 = (size_t)pvStack_a28;
            uStack_708 = 0;
            rVar39.proc_name = "rf_load_model_from_iqm";
            rVar39.file_name =
                 "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
            ;
            rVar39.line_in_file = 0x83d2;
            auVar97._8_8_ = (ulong)uStack_704 << 0x20;
            auVar97._0_8_ = pvStack_a28;
            auVar97._16_8_ = 0;
            __dest_01 = (*rStack_a50.allocator_proc)
                                  (&rStack_a50,rVar39,RF_AM_ALLOC,
                                   (rf_allocator_args)(auVar97 << 0x40));
            puVar114 = (uint *)((long)pvVar116 + uVar128 * 0x14 + 0x10);
            pvVar116 = pvVar141;
            memcpy(__dest_01,(void *)((ulong)*puVar114 + (long)puVar108),(size_t)__n);
            pvVar141 = pvVar116;
            if (uVar127 == 0) goto switchD_0013b4e9_caseD_3;
            uVar117 = 0;
            do {
              iVar16 = *(int *)((long)__dest + uVar117 * 0x18 + 8);
              uVar17 = iVar16 * 3;
              uVar120 = (iVar16 + *(int *)((long)__dest + uVar117 * 0x18 + 0xc)) * 3;
              if (uVar17 < uVar120) {
                pfVar111 = prVar131[uVar117].normals;
                pfVar19 = prVar131[uVar117].anim_normals;
                prVar132 = (rf_mesh *)0x0;
                do {
                  fVar135 = *(float *)((long)__dest_01 + (long)prVar132 * 4 + (ulong)uVar17 * 4);
                  pfVar111[(long)prVar132] = fVar135;
                  pfVar19[(long)prVar132] = fVar135;
                  prVar132 = (rf_mesh *)((long)&prVar132->vertex_count + 1);
                } while ((rf_mesh *)((ulong)uVar120 - (ulong)uVar17) != prVar132);
              }
              uVar117 = uVar117 + 1;
            } while (uVar117 != uVar127);
            break;
          case 3:
switchD_0013b4e9_caseD_3:
            break;
          case 4:
            pcStack_760 = 
            "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
            ;
            pcStack_758 = "rf_load_model_from_iqm";
            uStack_750 = 0x83f3;
            uStack_778 = 0;
            sStack_770 = (size_t)prStack_a20;
            uStack_768 = 0;
            rVar41.proc_name = "rf_load_model_from_iqm";
            rVar41.file_name =
                 "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
            ;
            rVar41.line_in_file = 0x83f3;
            auVar99._8_8_ = (ulong)uStack_764 << 0x20;
            auVar99._0_8_ = prStack_a20;
            auVar99._16_8_ = 0;
            __dest_03 = (*rStack_a50.allocator_proc)
                                  (&rStack_a50,rVar41,RF_AM_ALLOC,
                                   (rf_allocator_args)(auVar99 << 0x40));
            puVar114 = (uint *)((long)pvVar116 + uVar128 * 0x14 + 0x10);
            pvVar116 = pvVar141;
            memcpy(__dest_03,(void *)((ulong)*puVar114 + (long)puVar108),(size_t)prVar118);
            pvVar141 = pvVar116;
            if (uVar127 == 0) goto switchD_0013b4e9_caseD_3;
            uVar117 = 0;
            do {
              iVar16 = *(int *)((long)__dest + uVar117 * 0x18 + 8);
              uVar17 = iVar16 * 4;
              if (uVar17 < (uint)((iVar16 + *(int *)((long)__dest + uVar117 * 0x18 + 0xc)) * 4)) {
                uVar125 = (ulong)uVar17;
                piVar112 = prVar131[uVar117].bone_ids;
                do {
                  *piVar112 = (int)*(char *)((long)__dest_03 + uVar125);
                  uVar125 = uVar125 + 1;
                  piVar112 = piVar112 + 1;
                } while (uVar125 < (uint)((*(int *)((long)__dest + uVar117 * 0x18 + 0xc) +
                                          *(int *)((long)__dest + uVar117 * 0x18 + 8)) * 4));
              }
              uVar117 = uVar117 + 1;
              prVar132 = prVar131;
            } while (uVar117 != uVar127);
            break;
          case 5:
            pcStack_790 = 
            "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
            ;
            pcStack_788 = "rf_load_model_from_iqm";
            uStack_780 = 0x8403;
            uStack_7a8 = 0;
            sStack_7a0 = (size_t)prStack_a20;
            uStack_798 = 0;
            rVar42.proc_name = "rf_load_model_from_iqm";
            rVar42.file_name =
                 "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
            ;
            rVar42.line_in_file = 0x8403;
            auVar100._8_8_ = (ulong)uStack_794 << 0x20;
            auVar100._0_8_ = prStack_a20;
            auVar100._16_8_ = 0;
            __dest_04 = (*rStack_a50.allocator_proc)
                                  (&rStack_a50,rVar42,RF_AM_ALLOC,
                                   (rf_allocator_args)(auVar100 << 0x40));
            puVar114 = (uint *)((long)pvVar116 + uVar128 * 0x14 + 0x10);
            pvVar116 = pvVar141;
            memcpy(__dest_04,(void *)((ulong)*puVar114 + (long)puVar108),(size_t)prVar118);
            pvVar141 = pvVar116;
            if (uVar127 != 0) {
              uVar117 = 0;
              do {
                iVar16 = *(int *)((long)__dest + uVar117 * 0x18 + 8);
                uVar17 = iVar16 * 4;
                uVar120 = (iVar16 + *(int *)((long)__dest + uVar117 * 0x18 + 0xc)) * 4;
                if (uVar17 < uVar120) {
                  pfVar111 = prVar131[uVar117].bone_weights;
                  lVar123 = 0;
                  do {
                    bVar15 = *(byte *)((long)__dest_04 + lVar123 + (ulong)uVar17);
                    prVar132 = (rf_mesh *)(ulong)bVar15;
                    pfVar111[lVar123] = (float)bVar15 / 255.0;
                    lVar123 = lVar123 + 1;
                  } while ((ulong)uVar120 - (ulong)uVar17 != lVar123);
                }
                uVar117 = uVar117 + 1;
              } while (uVar117 != uVar127);
            }
          }
          uVar128 = uVar128 + 1;
        } while (uVar128 != uStack_a10);
      }
      pcStack_7c0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      pcStack_7b8 = "rf_load_model_from_iqm";
      uStack_7b0 = 0x8414;
      uStack_7d8 = 0;
      uVar117 = (ulong)uStack_2b8;
      sVar1 = uVar117 * 0x30;
      uStack_7c8 = 0;
      rVar43.proc_name = "rf_load_model_from_iqm";
      rVar43.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      rVar43.line_in_file = 0x8414;
      auVar101._8_8_ = (ulong)uStack_7c4 << 0x20;
      auVar101._0_8_ = sVar1;
      auVar101._16_8_ = 0;
      sStack_7d0 = sVar1;
      pvStack_a28 = (*rStack_a50.allocator_proc)
                              (&rStack_a50,rVar43,RF_AM_ALLOC,(rf_allocator_args)(auVar101 << 0x40))
      ;
      memcpy(pvStack_a28,(void *)((ulong)uStack_2b4 + (long)puVar108),sVar1);
      pcStack_7f0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      pcStack_7e8 = "rf_load_model_from_iqm";
      uStack_7e0 = 0x8418;
      puVar124 = (undefined4 *)0x0;
      uStack_808 = 0;
      lVar123 = uVar117 * 0x28;
      uStack_7f8 = 0;
      rVar44.proc_name = "rf_load_model_from_iqm";
      rVar44.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      rVar44.line_in_file = 0x8418;
      auVar102._8_8_ = (ulong)uStack_7f4 << 0x20;
      auVar102._0_8_ = lVar123;
      auVar102._16_8_ = 0;
      lStack_800 = lVar123;
      prVar118 = (rf_bone_info *)
                 (*rStack_a40.allocator_proc)
                           (&rStack_a40,rVar44,RF_AM_ALLOC,(rf_allocator_args)(auVar102 << 0x40));
      pcStack_820 = 
      "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      pcStack_818 = "rf_load_model_from_iqm";
      uStack_810 = 0x8419;
      uStack_838 = 0;
      uStack_828 = 0;
      rVar45.proc_name = "rf_load_model_from_iqm";
      rVar45.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      rVar45.line_in_file = 0x8419;
      auVar103._8_8_ = (ulong)uStack_824 << 0x20;
      auVar103._0_8_ = lVar123;
      auVar103._16_8_ = 0;
      lStack_830 = lVar123;
      prVar119 = (rf_transform *)
                 (*rStack_a40.allocator_proc)
                           (&rStack_a40,rVar45,RF_AM_ALLOC,(rf_allocator_args)(auVar103 << 0x40));
      prStack_a20 = prVar118;
      uStack_a10 = uVar117;
      if (uVar117 != 0) {
        puVar124 = (undefined4 *)((long)pvStack_a28 + 0x2c);
        lVar126 = 0;
        do {
          *(long *)(prVar118->name + lVar126 + 0x20) = (long)(int)puVar124[-10];
          puVar107 = (undefined8 *)
                     ((long)puVar108 + (ulong)(uint)puVar124[-0xb] + (ulong)uStack_2dc);
          uVar109 = *puVar107;
          uVar8 = puVar107[1];
          puVar107 = (undefined8 *)
                     ((long)puVar108 + (ulong)(uint)puVar124[-0xb] + (ulong)uStack_2dc + 0x10);
          uVar22 = puVar107[1];
          *(undefined8 *)(prVar118->name + lVar126 + 0x10) = *puVar107;
          *(undefined8 *)(prVar118->name + lVar126 + 0x10 + 8) = uVar22;
          *(undefined8 *)(prVar118->name + lVar126) = uVar109;
          *(undefined8 *)(prVar118->name + lVar126 + 8) = uVar8;
          *(undefined4 *)((long)&(prVar119->translation).x + lVar126) = puVar124[-9];
          *(undefined4 *)((long)&(prVar119->translation).y + lVar126) = puVar124[-8];
          *(undefined4 *)((long)&(prVar119->translation).z + lVar126) = puVar124[-7];
          *(undefined4 *)((long)&(prVar119->rotation).x + lVar126) = puVar124[-6];
          *(undefined4 *)((long)&(prVar119->rotation).y + lVar126) = puVar124[-5];
          *(undefined4 *)((long)&(prVar119->rotation).z + lVar126) = puVar124[-4];
          *(undefined4 *)((long)&(prVar119->rotation).w + lVar126) = puVar124[-3];
          *(undefined4 *)((long)&(prVar119->scale).x + lVar126) = puVar124[-2];
          *(undefined4 *)((long)&(prVar119->scale).y + lVar126) = puVar124[-1];
          *(undefined4 *)((long)&(prVar119->scale).z + lVar126) = *puVar124;
          lVar126 = lVar126 + 0x28;
          puVar124 = puVar124 + 0xc;
        } while (lVar123 != lVar126);
        if (uVar117 != 0) {
          lVar126 = 0;
          do {
            lVar20 = *(long *)(prVar118->name + lVar126 + 0x20);
            if (-1 < lVar20) {
              uVar2 = prVar119[lVar20].rotation.x;
              uVar9 = prVar119[lVar20].rotation.y;
              uVar3 = prVar119[lVar20].rotation.z;
              uVar10 = prVar119[lVar20].rotation.w;
              uVar109 = *(undefined8 *)((long)&(prVar119->rotation).x + lVar126);
              uVar8 = *(undefined8 *)((long)&(prVar119->rotation).z + lVar126);
              fVar135 = (float)uVar109;
              fVar137 = (float)((ulong)uVar109 >> 0x20);
              fVar138 = (float)uVar8;
              fVar139 = (float)((ulong)uVar8 >> 0x20);
              *(ulong *)((long)&(prVar119->rotation).x + lVar126) =
                   CONCAT44(fVar138 * -(float)uVar2 +
                            fVar135 * (float)uVar3 +
                            (float)uVar9 * fVar139 + (float)uVar10 * fVar137,
                            fVar137 * -(float)uVar3 +
                            fVar138 * (float)uVar9 +
                            (float)uVar2 * fVar139 + (float)uVar10 * fVar135);
              *(ulong *)((long)&(prVar119->rotation).z + lVar126) =
                   CONCAT44((fVar137 * -(float)uVar9 +
                            fVar139 * (float)uVar10 + fVar135 * -(float)uVar2) -
                            fVar138 * (float)uVar3,
                            (fVar137 * (float)uVar2 +
                            fVar139 * (float)uVar3 + (float)uVar10 * fVar138) -
                            fVar135 * (float)uVar9);
              uVar4 = prVar119[*(long *)(prVar118->name + lVar126 + 0x20)].rotation.x;
              uVar11 = prVar119[*(long *)(prVar118->name + lVar126 + 0x20)].rotation.y;
              q.y = (float)uVar11;
              q.x = (float)uVar4;
              uVar5 = prVar119[*(long *)(prVar118->name + lVar126 + 0x20)].rotation.z;
              uVar12 = prVar119[*(long *)(prVar118->name + lVar126 + 0x20)].rotation.w;
              q.w = (float)uVar12;
              q.z = (float)uVar5;
              rVar140.z = *(float *)((long)&(prVar119->translation).z + lVar126);
              rVar140._0_8_ = *(undefined8 *)((long)&(prVar119->translation).x + lVar126);
              rVar140 = rf_vec3_rotate_by_quaternion(rVar140,q);
              *(long *)((long)&(prVar119->translation).x + lVar126) = rVar140._0_8_;
              *(float *)((long)&(prVar119->translation).z + lVar126) = rVar140.z;
              uVar6 = prVar119[*(long *)(prVar118->name + lVar126 + 0x20)].translation.x;
              uVar13 = prVar119[*(long *)(prVar118->name + lVar126 + 0x20)].translation.y;
              fVar135 = prVar119[*(long *)(prVar118->name + lVar126 + 0x20)].translation.z;
              *(ulong *)((long)&(prVar119->translation).x + lVar126) =
                   CONCAT44((float)uVar13 + rVar140.y,(float)uVar6 + rVar140.x);
              *(float *)((long)&(prVar119->translation).z + lVar126) = rVar140.z + fVar135;
              uVar109 = *(undefined8 *)((long)&(prVar119->scale).x + lVar126);
              uVar7 = prVar119[*(long *)(prVar118->name + lVar126 + 0x20)].scale.x;
              uVar14 = prVar119[*(long *)(prVar118->name + lVar126 + 0x20)].scale.y;
              fVar135 = prVar119[*(long *)(prVar118->name + lVar126 + 0x20)].scale.z;
              *(ulong *)((long)&(prVar119->scale).x + lVar126) =
                   CONCAT44((float)uVar14 * (float)((ulong)uVar109 >> 0x20),
                            (float)uVar7 * (float)uVar109);
              *(float *)((long)&(prVar119->scale).z + lVar126) =
                   *(float *)((long)&(prVar119->scale).z + lVar126) * fVar135;
            }
            lVar126 = lVar126 + 0x28;
          } while (lVar123 != lVar126);
        }
      }
      pcStack_850 = 
      "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      pcStack_848 = "rf_load_model_from_iqm";
      uStack_840 = 0x843c;
      uStack_860 = 0;
      uStack_858 = 0;
      rVar46.proc_name = "rf_load_model_from_iqm";
      rVar46.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      rVar46.line_in_file = 0x843c;
      rVar60.size_to_allocate_or_reallocate = 0;
      rVar60.pointer_to_free_or_realloc = __dest;
      rVar60._16_8_ = (ulong)uStack_854 << 0x20;
      pvStack_868 = __dest;
      (*rStack_a50.allocator_proc)(&rStack_a50,rVar46,RF_AM_FREE,rVar60);
      pcStack_880 = 
      "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      pcStack_878 = "rf_load_model_from_iqm";
      uStack_870 = 0x843d;
      pvStack_898 = pvStack_a00;
      uStack_890 = 0;
      uStack_888 = 0;
      rVar47.proc_name = "rf_load_model_from_iqm";
      rVar47.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      rVar47.line_in_file = 0x843d;
      rVar61.size_to_allocate_or_reallocate = 0;
      rVar61.pointer_to_free_or_realloc = pvStack_a00;
      rVar61._16_8_ = (ulong)uStack_884 << 0x20;
      (*rStack_a50.allocator_proc)(&rStack_a50,rVar47,RF_AM_FREE,rVar61);
      pcStack_8b0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      pcStack_8a8 = "rf_load_model_from_iqm";
      uStack_8a0 = 0x843e;
      uStack_8c0 = 0;
      uStack_8b8 = 0;
      rVar48.proc_name = "rf_load_model_from_iqm";
      rVar48.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      rVar48.line_in_file = 0x843e;
      rVar62.size_to_allocate_or_reallocate = 0;
      rVar62.pointer_to_free_or_realloc = pvVar141;
      rVar62._16_8_ = (ulong)uStack_8b4 << 0x20;
      pvStack_8c8 = pvVar141;
      (*rStack_a50.allocator_proc)(&rStack_a50,rVar48,RF_AM_FREE,rVar62);
      pcStack_8e0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      pcStack_8d8 = "rf_load_model_from_iqm";
      uStack_8d0 = 0x843f;
      uStack_8f0 = 0;
      uStack_8e8 = 0;
      rVar49.proc_name = "rf_load_model_from_iqm";
      rVar49.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      rVar49.line_in_file = 0x843f;
      rVar63.size_to_allocate_or_reallocate = 0;
      rVar63.pointer_to_free_or_realloc = __dest_00;
      rVar63._16_8_ = (ulong)uStack_8e4 << 0x20;
      pvStack_8f8 = __dest_00;
      (*rStack_a50.allocator_proc)(&rStack_a50,rVar49,RF_AM_FREE,rVar63);
      pcStack_910 = 
      "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      pcStack_908 = "rf_load_model_from_iqm";
      uStack_900 = 0x8440;
      uStack_920 = 0;
      uStack_918 = 0;
      rVar50.proc_name = "rf_load_model_from_iqm";
      rVar50.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      rVar50.line_in_file = 0x8440;
      rVar64.size_to_allocate_or_reallocate = 0;
      rVar64.pointer_to_free_or_realloc = __dest_01;
      rVar64._16_8_ = (ulong)uStack_914 << 0x20;
      pvStack_928 = __dest_01;
      (*rStack_a50.allocator_proc)(&rStack_a50,rVar50,RF_AM_FREE,rVar64);
      pcStack_940 = 
      "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      pcStack_938 = "rf_load_model_from_iqm";
      uStack_930 = 0x8441;
      uStack_950 = 0;
      uStack_948 = 0;
      rVar51.proc_name = "rf_load_model_from_iqm";
      rVar51.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      rVar51.line_in_file = 0x8441;
      rVar65.size_to_allocate_or_reallocate = 0;
      rVar65.pointer_to_free_or_realloc = __dest_02;
      rVar65._16_8_ = (ulong)uStack_944 << 0x20;
      pvStack_958 = __dest_02;
      (*rStack_a50.allocator_proc)(&rStack_a50,rVar51,RF_AM_FREE,rVar65);
      pcStack_970 = 
      "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      pcStack_968 = "rf_load_model_from_iqm";
      uStack_960 = 0x8442;
      uStack_980 = 0;
      uStack_978 = 0;
      rVar52.proc_name = "rf_load_model_from_iqm";
      rVar52.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      rVar52.line_in_file = 0x8442;
      rVar66.size_to_allocate_or_reallocate = 0;
      rVar66.pointer_to_free_or_realloc = __dest_03;
      rVar66._16_8_ = (ulong)uStack_974 << 0x20;
      pvStack_988 = __dest_03;
      (*rStack_a50.allocator_proc)(&rStack_a50,rVar52,RF_AM_FREE,rVar66);
      pcStack_9a0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      pcStack_998 = "rf_load_model_from_iqm";
      uStack_990 = 0x8443;
      uStack_9b0 = 0;
      uStack_9a8 = 0;
      rVar53.proc_name = "rf_load_model_from_iqm";
      rVar53.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      rVar53.line_in_file = 0x8443;
      rVar67.size_to_allocate_or_reallocate = 0;
      rVar67.pointer_to_free_or_realloc = __dest_04;
      rVar67._16_8_ = (ulong)uStack_9a4 << 0x20;
      pvStack_9b8 = __dest_04;
      (*rStack_a50.allocator_proc)(&rStack_a50,rVar53,RF_AM_FREE,rVar67);
      pcStack_9d0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      pcStack_9c8 = "rf_load_model_from_iqm";
      uStack_9c0 = 0x8444;
      pvStack_9e8 = pvStack_a28;
      uStack_9e0 = 0;
      uStack_9d8 = 0;
      rVar54.proc_name = "rf_load_model_from_iqm";
      rVar54.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      rVar54.line_in_file = 0x8444;
      rVar68.size_to_allocate_or_reallocate = 0;
      rVar68.pointer_to_free_or_realloc = pvStack_a28;
      rVar68._16_8_ = (ulong)uStack_9d4 << 0x20;
      (*rStack_a50.allocator_proc)(&rStack_a50,rVar54,RF_AM_FREE,rVar68);
      lVar123 = lStack_a08;
      rStack_370.user_data = rStack_a40.user_data;
      rStack_370.allocator_proc = rStack_a40.allocator_proc;
      if (uStack_a18 == 0) {
        pcStack_318 = 
        "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
        ;
        pcStack_310 = "rf_load_meshes_and_materials_for_model";
        uStack_308 = 0x8160;
        rf_log_impl(4,0x17d802);
        pcStack_388 = 
        "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
        ;
        pcStack_380 = "rf_load_meshes_and_materials_for_model";
        uStack_378 = 0x8163;
        uStack_3a0 = 0;
        uStack_398 = 0x70;
        uStack_390 = 0;
        rVar55.proc_name = "rf_load_meshes_and_materials_for_model";
        rVar55.file_name =
             "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
        ;
        rVar55.line_in_file = 0x8163;
        rVar69._16_8_ = (ulong)uStack_38c << 0x20;
        rVar69.pointer_to_free_or_realloc = (void *)SUB168(ZEXT816(0x70) << 0x40,0);
        rVar69.size_to_allocate_or_reallocate = SUB168(ZEXT816(0x70) << 0x40,8);
        prVar110 = (rf_mesh *)(*rStack_370.allocator_proc)(&rStack_370,rVar55,RF_AM_ALLOC,rVar69);
        prVar110->vertex_count = 0;
        prVar110->triangle_count = 0;
        prVar110->vertices = (float *)0x0;
        prVar110->texcoords = (float *)0x0;
        prVar110->texcoords2 = (float *)0x0;
        prVar110->normals = (float *)0x0;
        prVar110->tangents = (float *)0x0;
        prVar110->colors = (uchar *)0x0;
        prVar110->indices = (unsigned_short *)0x0;
        prVar110->anim_vertices = (float *)0x0;
        prVar110->anim_normals = (float *)0x0;
        prVar110->bone_ids = (int *)0x0;
        prVar110->bone_weights = (float *)0x0;
        *(undefined8 *)&prVar110->vao_id = 0;
        prVar110->vbo_id = (uint *)0x0;
        allocator_01.allocator_proc = rStack_370.allocator_proc;
        allocator_01.user_data = rStack_370.user_data;
        temp_allocator_00.allocator_proc = (rf_allocator_proc *)prVar132;
        temp_allocator_00.user_data = puVar124;
        rf_gen_mesh_cube(&rStack_280,1.0,1.0,1.0,allocator_01,temp_allocator_00);
        prVar132 = &rStack_280;
        prVar131 = prVar110;
        for (lVar123 = 0xe; lVar123 != 0; lVar123 = lVar123 + -1) {
          iVar16 = prVar132->triangle_count;
          prVar131->vertex_count = prVar132->vertex_count;
          prVar131->triangle_count = iVar16;
          prVar132 = (rf_mesh *)((long)prVar132 + (ulong)bVar134 * -0x10 + 8);
          prVar131 = (rf_mesh *)((long)prVar131 + (ulong)bVar134 * -0x10 + 8);
        }
        uStack_a18 = 1;
      }
      else {
        lVar126 = 0;
        prVar110 = prVar131;
        do {
          rf_gfx_load_mesh((rf_mesh *)((long)&prVar131->vertex_count + lVar126),false);
          lVar126 = lVar126 + 0x70;
        } while (lVar123 != lVar126);
      }
      pcStack_330 = 
      "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      pcStack_328 = "rf_load_meshes_and_materials_for_model";
      uStack_320 = 0x8170;
      rf_log_impl(4,0x17d831);
      pcStack_3b8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      pcStack_3b0 = "rf_load_meshes_and_materials_for_model";
      uStack_3a8 = 0x8173;
      uStack_3d0 = 0;
      uStack_3c8 = 0x98;
      uStack_3c0 = 0;
      rVar56.proc_name = "rf_load_meshes_and_materials_for_model";
      rVar56.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      rVar56.line_in_file = 0x8173;
      rVar70._16_8_ = (ulong)uStack_3bc << 0x20;
      rVar70.pointer_to_free_or_realloc = (void *)SUB168(ZEXT816(0x98) << 0x40,0);
      rVar70.size_to_allocate_or_reallocate = SUB168(ZEXT816(0x98) << 0x40,8);
      __s = (rf_material *)(*rStack_370.allocator_proc)(&rStack_370,rVar56,RF_AM_ALLOC,rVar70);
      memset(__s,0,0x98);
      allocator_00.allocator_proc = (rf_allocator_proc *)prVar110;
      allocator_00.user_data = pvVar141;
      rf_load_default_material(allocator_00);
      memcpy(__s,&rStack_280,0x98);
      uVar117 = uStack_a18;
      rStack_280._0_8_ =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      rStack_280.vertices = (float *)0x17d7db;
      rStack_280.texcoords = (float *)0x8179;
      uStack_3e8 = 0;
      sVar1 = uStack_a18 * 4;
      uStack_3d8 = 0;
      rVar57.proc_name = "rf_load_meshes_and_materials_for_model";
      rVar57.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      rVar57.line_in_file = 0x8179;
      auVar104._8_8_ = (ulong)uStack_3d4 << 0x20;
      auVar104._0_8_ = sVar1;
      auVar104._16_8_ = 0;
      sStack_3e0 = sVar1;
      piVar112 = (int *)(*rStack_370.allocator_proc)
                                  (&rStack_370,rVar57,RF_AM_ALLOC,
                                   (rf_allocator_args)(auVar104 << 0x40));
      memset(piVar112,0,sVar1);
      (prStack_9f8->transform).m0 = 1.0;
      (prStack_9f8->transform).m4 = 0.0;
      (prStack_9f8->transform).m8 = 0.0;
      (prStack_9f8->transform).m12 = 0.0;
      (prStack_9f8->transform).m1 = 0.0;
      (prStack_9f8->transform).m5 = 1.0;
      (prStack_9f8->transform).m9 = 0.0;
      (prStack_9f8->transform).m13 = 0.0;
      (prStack_9f8->transform).m2 = 0.0;
      (prStack_9f8->transform).m6 = 0.0;
      (prStack_9f8->transform).m10 = 1.0;
      (prStack_9f8->transform).m14 = 0.0;
      (prStack_9f8->transform).m3 = 0.0;
      (prStack_9f8->transform).m7 = 0.0;
      (prStack_9f8->transform).m11 = 0.0;
      (prStack_9f8->transform).m15 = 1.0;
      prStack_9f8->mesh_count = uVar117;
      prStack_9f8->meshes = prVar110;
      prStack_9f8->material_count = 1;
      prStack_9f8->materials = __s;
      prStack_9f8->mesh_material = piVar112;
      prStack_9f8->bone_count = uStack_a10;
      prStack_9f8->bones = prStack_a20;
      prStack_9f8->bind_pose = prVar119;
      return prStack_9f8;
    }
    pcStack_360 = 
    "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    pcStack_358 = "rf_load_model_from_iqm";
    uStack_350 = 0x8371;
    rf_log_impl(4,0x17bb97,msg);
  }
  else {
    pcStack_348 = 
    "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    pcStack_340 = "rf_load_model_from_iqm";
    uStack_338 = 0x836b;
    rf_log_impl(4,0x17bb6f,msg);
  }
  prVar129->bones = (rf_bone_info *)0x0;
  prVar129->bind_pose = (rf_transform *)0x0;
  prVar129->mesh_material = (int *)0x0;
  prVar129->bone_count = 0;
  prVar129->material_count = 0;
  prVar129->materials = (rf_material *)0x0;
  prVar129->mesh_count = 0;
  prVar129->meshes = (rf_mesh *)0x0;
  (prVar129->transform).m3 = 0.0;
  (prVar129->transform).m7 = 0.0;
  (prVar129->transform).m11 = 0.0;
  (prVar129->transform).m15 = 0.0;
  (prVar129->transform).m2 = 0.0;
  (prVar129->transform).m6 = 0.0;
  (prVar129->transform).m10 = 0.0;
  (prVar129->transform).m14 = 0.0;
  (prVar129->transform).m1 = 0.0;
  (prVar129->transform).m5 = 0.0;
  (prVar129->transform).m9 = 0.0;
  (prVar129->transform).m13 = 0.0;
  *(void **)&prVar129->transform = (void *)0x0;
  *(rf_allocator_proc **)&(prVar129->transform).m8 = (rf_allocator_proc *)0x0;
  return prVar129;
}

Assistant:

RF_API rf_model rf_load_model_from_obj(const char* filename, rf_allocator allocator, rf_allocator temp_allocator, rf_io_callbacks io)
{
    rf_model model  = {0};
    allocator = allocator;

    tinyobj_attrib_t attrib     = {0};
    tinyobj_shape_t* meshes     = NULL;
    size_t           mesh_count = 0;

    tinyobj_material_t* materials      = NULL;
    size_t              material_count = 0;

    RF_SET_GLOBAL_DEPENDENCIES_ALLOCATOR(temp_allocator); // Set to NULL at the end of the function
    RF_SET_TINYOBJ_IO_CALLBACKS(io);
    {
        unsigned int flags = TINYOBJ_FLAG_TRIANGULATE;
        int ret            = tinyobj_parse_obj(&attrib, &meshes, (size_t*) &mesh_count, &materials, &material_count, filename, rf_tinyobj_file_reader_callback, flags);

        if (ret != TINYOBJ_SUCCESS)
        {
            RF_LOG(RF_LOG_TYPE_WARNING, "Model data could not be loaded. Filename %s", filename);
        }
        else
        {
            RF_LOG(RF_LOG_TYPE_INFO, "Model data loaded successfully: %i meshes / %i materials, filename: %s", mesh_count, material_count, filename);
        }

        // Init model meshes array
        {
            // TODO: Support multiple meshes... in the meantime, only one mesh is returned
            //model.mesh_count = mesh_count;
            model.mesh_count = 1;
            model.meshes     = (rf_mesh*) RF_ALLOC(allocator, model.mesh_count * sizeof(rf_mesh));
            memset(model.meshes, 0, model.mesh_count * sizeof(rf_mesh));
        }

        // Init model materials array
        if (material_count > 0)
        {
            model.material_count = material_count;
            model.materials      = (rf_material*) RF_ALLOC(allocator, model.material_count * sizeof(rf_material));
            memset(model.materials, 0, model.material_count * sizeof(rf_material));
        }

        model.mesh_material = (int*) RF_ALLOC(allocator, model.mesh_count * sizeof(int));
        memset(model.mesh_material, 0, model.mesh_count * sizeof(int));

        // Init model meshes
        for (rf_int m = 0; m < 1; m++)
        {
            rf_mesh mesh = (rf_mesh)
            {
                .vertex_count   = attrib.num_faces * 3,
                .triangle_count = attrib.num_faces,

                .vertices  = (float*)        RF_ALLOC(allocator, (attrib.num_faces * 3) * 3 * sizeof(float)),
                .texcoords = (float*)        RF_ALLOC(allocator, (attrib.num_faces * 3) * 2 * sizeof(float)),
                .normals   = (float*)        RF_ALLOC(allocator, (attrib.num_faces * 3) * 3 * sizeof(float)),
                .vbo_id    = (unsigned int*) RF_ALLOC(allocator, RF_MAX_MESH_VBO            * sizeof(unsigned int)),
            };

            memset(mesh.vertices,  0, mesh.vertex_count * 3 * sizeof(float));
            memset(mesh.texcoords, 0, mesh.vertex_count * 2 * sizeof(float));
            memset(mesh.normals,   0, mesh.vertex_count * 3 * sizeof(float));
            memset(mesh.vbo_id,    0, RF_MAX_MESH_VBO       * sizeof(unsigned int));

            int vCount  = 0;
            int vtCount = 0;
            int vnCount = 0;

            for (rf_int f = 0; f < attrib.num_faces; f++)
            {
                // Get indices for the face
                tinyobj_vertex_index_t idx0 = attrib.faces[3 * f + 0];
                tinyobj_vertex_index_t idx1 = attrib.faces[3 * f + 1];
                tinyobj_vertex_index_t idx2 = attrib.faces[3 * f + 2];

                // RF_LOG(RF_LOG_TYPE_DEBUG, "Face %i index: v %i/%i/%i . vt %i/%i/%i . vn %i/%i/%i\n", f, idx0.v_idx, idx1.v_idx, idx2.v_idx, idx0.vt_idx, idx1.vt_idx, idx2.vt_idx, idx0.vn_idx, idx1.vn_idx, idx2.vn_idx);

                // Fill vertices buffer (float) using vertex index of the face
                for (rf_int v = 0; v < 3; v++) { mesh.vertices[vCount + v] = attrib.vertices[idx0.v_idx * 3 + v]; }
                vCount +=3;

                for (rf_int v = 0; v < 3; v++) { mesh.vertices[vCount + v] = attrib.vertices[idx1.v_idx * 3 + v]; }
                vCount +=3;

                for (rf_int v = 0; v < 3; v++) { mesh.vertices[vCount + v] = attrib.vertices[idx2.v_idx * 3 + v]; }
                vCount +=3;

                // Fill texcoords buffer (float) using vertex index of the face
                // NOTE: Y-coordinate must be flipped upside-down
                mesh.texcoords[vtCount + 0] = attrib.texcoords[idx0.vt_idx * 2 + 0];
                mesh.texcoords[vtCount + 1] = 1.0f - attrib.texcoords[idx0.vt_idx * 2 + 1]; vtCount += 2;
                mesh.texcoords[vtCount + 0] = attrib.texcoords[idx1.vt_idx * 2 + 0];
                mesh.texcoords[vtCount + 1] = 1.0f - attrib.texcoords[idx1.vt_idx * 2 + 1]; vtCount += 2;
                mesh.texcoords[vtCount + 0] = attrib.texcoords[idx2.vt_idx * 2 + 0];
                mesh.texcoords[vtCount + 1] = 1.0f - attrib.texcoords[idx2.vt_idx * 2 + 1]; vtCount += 2;

                // Fill normals buffer (float) using vertex index of the face
                for (rf_int v = 0; v < 3; v++) { mesh.normals[vnCount + v] = attrib.normals[idx0.vn_idx * 3 + v]; }
                vnCount +=3;

                for (rf_int v = 0; v < 3; v++) { mesh.normals[vnCount + v] = attrib.normals[idx1.vn_idx * 3 + v]; }
                vnCount +=3;

                for (rf_int v = 0; v < 3; v++) { mesh.normals[vnCount + v] = attrib.normals[idx2.vn_idx * 3 + v]; }
                vnCount +=3;
            }

            model.meshes[m] = mesh; // Assign mesh data to model

            // Assign mesh material for current mesh
            model.mesh_material[m] = attrib.material_ids[m];

            // Set unfound materials to default
            if (model.mesh_material[m] == -1) { model.mesh_material[m] = 0; }
        }

        // Init model materials
        for (rf_int m = 0; m < material_count; m++)
        {
            // Init material to default
            // NOTE: Uses default shader, only RF_MAP_DIFFUSE supported
            model.materials[m] = rf_load_default_material(allocator);
            model.materials[m].maps[RF_MAP_DIFFUSE].texture = rf_get_default_texture(); // Get default texture, in case no texture is defined

            if (materials[m].diffuse_texname != NULL)
            {
                model.materials[m].maps[RF_MAP_DIFFUSE].texture = rf_load_texture_from_file(materials[m].diffuse_texname, temp_allocator, io); //char* diffuse_texname; // map_Kd
            }

            model.materials[m].maps[RF_MAP_DIFFUSE].color = (rf_color)
            {
                (float)(materials[m].diffuse[0] * 255.0f),
                (float)(materials[m].diffuse[1] * 255.0f),
                (float)(materials[m].diffuse[2] * 255.0f),
                255
            };

            model.materials[m].maps[RF_MAP_DIFFUSE].value = 0.0f;

            if (materials[m].specular_texname != NULL)
            {
                model.materials[m].maps[RF_MAP_SPECULAR].texture = rf_load_texture_from_file(materials[m].specular_texname, temp_allocator, io); //char* specular_texname; // map_Ks
            }

            model.materials[m].maps[RF_MAP_SPECULAR].color = (rf_color)
            {
                (float)(materials[m].specular[0] * 255.0f),
                (float)(materials[m].specular[1] * 255.0f),
                (float)(materials[m].specular[2] * 255.0f),
                255
            };

            model.materials[m].maps[RF_MAP_SPECULAR].value = 0.0f;

            if (materials[m].bump_texname != NULL)
            {
                model.materials[m].maps[RF_MAP_NORMAL].texture = rf_load_texture_from_file(materials[m].bump_texname, temp_allocator, io); //char* bump_texname; // map_bump, bump
            }

            model.materials[m].maps[RF_MAP_NORMAL].color = RF_WHITE;
            model.materials[m].maps[RF_MAP_NORMAL].value = materials[m].shininess;

            model.materials[m].maps[RF_MAP_EMISSION].color = (rf_color)
            {
                (float)(materials[m].emission[0] * 255.0f),
                (float)(materials[m].emission[1] * 255.0f),
                (float)(materials[m].emission[2] * 255.0f),
                255
            };

            if (materials[m].displacement_texname != NULL)
            {
                model.materials[m].maps[RF_MAP_HEIGHT].texture = rf_load_texture_from_file(materials[m].displacement_texname, temp_allocator, io); //char* displacement_texname; // disp
            }
        }

        tinyobj_attrib_free(&attrib);
        tinyobj_shapes_free(meshes, mesh_count);
        tinyobj_materials_free(materials, material_count);
    }
    RF_SET_GLOBAL_DEPENDENCIES_ALLOCATOR(RF_NULL_ALLOCATOR);
    RF_SET_TINYOBJ_IO_CALLBACKS(RF_NULL_IO);

    // NOTE: At this point we have all model data loaded
    RF_LOG(RF_LOG_TYPE_INFO, "Model loaded successfully in RAM. Filename: %s", filename);

    return rf_load_meshes_and_materials_for_model(model, allocator, temp_allocator);
}